

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void pack_16x9_init(uint16_t *src,ptrdiff_t pitch,__m256i *sig)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 (*in_RDX) [32];
  long in_RSI;
  undefined1 (*in_RDI) [32];
  __m256i s6;
  __m256i s5;
  __m256i s4;
  __m256i s3;
  __m256i s2;
  __m256i s1;
  __m256i s0;
  __m256i u3;
  __m256i u2;
  __m256i u1;
  __m256i u0;
  
  pauVar1 = (undefined1 (*) [32])(*in_RDI + in_RSI * 2);
  pauVar2 = (undefined1 (*) [32])(*in_RDI + in_RSI * 4);
  auVar15 = *pauVar2;
  auVar13 = *pauVar2;
  pauVar3 = (undefined1 (*) [32])(*in_RDI + in_RSI * 6);
  auVar19 = *pauVar3;
  auVar17 = *pauVar3;
  auVar16 = *pauVar3;
  auVar14 = *pauVar3;
  pauVar3 = (undefined1 (*) [32])(*in_RDI + in_RSI * 8);
  auVar23 = *pauVar3;
  auVar21 = *pauVar3;
  auVar20 = *pauVar3;
  auVar18 = *pauVar3;
  pauVar3 = (undefined1 (*) [32])(*in_RDI + in_RSI * 10);
  auVar27 = *pauVar3;
  auVar25 = *pauVar3;
  auVar24 = *pauVar3;
  auVar22 = *pauVar3;
  pauVar3 = (undefined1 (*) [32])(*in_RDI + in_RSI * 0xc);
  uVar9 = *(undefined8 *)*pauVar3;
  uVar10 = *(undefined8 *)(*pauVar3 + 8);
  uVar11 = *(undefined8 *)(*pauVar3 + 0x10);
  uVar12 = *(undefined8 *)(*pauVar3 + 0x18);
  auVar28 = *pauVar3;
  auVar26 = *pauVar3;
  auVar5 = vperm2i128_avx2(*in_RDI,*pauVar1,0x20);
  auVar6 = vperm2i128_avx2(*in_RDI,*pauVar1,0x31);
  auVar7 = vperm2i128_avx2(*pauVar1,*pauVar2,0x20);
  auVar8 = vperm2i128_avx2(*pauVar1,*pauVar2,0x31);
  auVar4 = vpunpcklwd_avx2(auVar5,auVar7);
  *in_RDX = auVar4;
  auVar4 = vpunpckhwd_avx2(auVar5,auVar7);
  in_RDX[4] = auVar4;
  auVar4 = vpunpcklwd_avx2(auVar6,auVar8);
  in_RDX[8] = auVar4;
  auVar4 = vpunpckhwd_avx2(auVar6,auVar8);
  in_RDX[0xc] = auVar4;
  auVar5 = vperm2i128_avx2(auVar13,auVar14,0x20);
  auVar6 = vperm2i128_avx2(auVar15,auVar16,0x31);
  auVar7 = vperm2i128_avx2(auVar17,auVar18,0x20);
  auVar8 = vperm2i128_avx2(auVar19,auVar20,0x31);
  auVar4 = vpunpcklwd_avx2(auVar5,auVar7);
  in_RDX[1] = auVar4;
  auVar4 = vpunpckhwd_avx2(auVar5,auVar7);
  in_RDX[5] = auVar4;
  auVar4 = vpunpcklwd_avx2(auVar6,auVar8);
  in_RDX[9] = auVar4;
  auVar4 = vpunpckhwd_avx2(auVar6,auVar8);
  in_RDX[0xd] = auVar4;
  auVar5 = vperm2i128_avx2(auVar21,auVar22,0x20);
  auVar6 = vperm2i128_avx2(auVar23,auVar24,0x31);
  auVar7 = vperm2i128_avx2(auVar25,auVar26,0x20);
  auVar8 = vperm2i128_avx2(auVar27,auVar28,0x31);
  auVar4 = vpunpcklwd_avx2(auVar5,auVar7);
  in_RDX[2] = auVar4;
  auVar4 = vpunpckhwd_avx2(auVar5,auVar7);
  in_RDX[6] = auVar4;
  auVar4 = vpunpcklwd_avx2(auVar6,auVar8);
  in_RDX[10] = auVar4;
  auVar4 = vpunpckhwd_avx2(auVar6,auVar8);
  in_RDX[0xe] = auVar4;
  *(undefined8 *)in_RDX[0x10] = uVar9;
  *(undefined8 *)(in_RDX[0x10] + 8) = uVar10;
  *(undefined8 *)(in_RDX[0x10] + 0x10) = uVar11;
  *(undefined8 *)(in_RDX[0x10] + 0x18) = uVar12;
  return;
}

Assistant:

static void pack_16x9_init(const uint16_t *src, ptrdiff_t pitch, __m256i *sig) {
  __m256i u0, u1, u2, u3;
  // load 0-6 rows
  const __m256i s0 = _mm256_loadu_si256((const __m256i *)src);
  const __m256i s1 = _mm256_loadu_si256((const __m256i *)(src + pitch));
  const __m256i s2 = _mm256_loadu_si256((const __m256i *)(src + 2 * pitch));
  const __m256i s3 = _mm256_loadu_si256((const __m256i *)(src + 3 * pitch));
  const __m256i s4 = _mm256_loadu_si256((const __m256i *)(src + 4 * pitch));
  const __m256i s5 = _mm256_loadu_si256((const __m256i *)(src + 5 * pitch));
  const __m256i s6 = _mm256_loadu_si256((const __m256i *)(src + 6 * pitch));

  u0 = _mm256_permute2x128_si256(s0, s1, 0x20);  // 0, 1 low
  u1 = _mm256_permute2x128_si256(s0, s1, 0x31);  // 0, 1 high

  u2 = _mm256_permute2x128_si256(s1, s2, 0x20);  // 1, 2 low
  u3 = _mm256_permute2x128_si256(s1, s2, 0x31);  // 1, 2 high

  sig[0] = _mm256_unpacklo_epi16(u0, u2);
  sig[4] = _mm256_unpackhi_epi16(u0, u2);

  sig[8] = _mm256_unpacklo_epi16(u1, u3);
  sig[12] = _mm256_unpackhi_epi16(u1, u3);

  u0 = _mm256_permute2x128_si256(s2, s3, 0x20);
  u1 = _mm256_permute2x128_si256(s2, s3, 0x31);

  u2 = _mm256_permute2x128_si256(s3, s4, 0x20);
  u3 = _mm256_permute2x128_si256(s3, s4, 0x31);

  sig[1] = _mm256_unpacklo_epi16(u0, u2);
  sig[5] = _mm256_unpackhi_epi16(u0, u2);

  sig[9] = _mm256_unpacklo_epi16(u1, u3);
  sig[13] = _mm256_unpackhi_epi16(u1, u3);

  u0 = _mm256_permute2x128_si256(s4, s5, 0x20);
  u1 = _mm256_permute2x128_si256(s4, s5, 0x31);

  u2 = _mm256_permute2x128_si256(s5, s6, 0x20);
  u3 = _mm256_permute2x128_si256(s5, s6, 0x31);

  sig[2] = _mm256_unpacklo_epi16(u0, u2);
  sig[6] = _mm256_unpackhi_epi16(u0, u2);

  sig[10] = _mm256_unpacklo_epi16(u1, u3);
  sig[14] = _mm256_unpackhi_epi16(u1, u3);

  sig[16] = s6;
}